

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::NodeTranslator::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,NodeTranslator *this,
          Reader filename)

{
  Resolver *pRVar1;
  ErrorReporter *pEVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Reader RVar12;
  String local_98;
  ArrayDisposer *pAStack_80;
  char local_78;
  PointerReader local_58;
  ArrayPtr<const_char> local_30;
  
  pRVar1 = this->resolver;
  bVar7 = filename._reader.pointerCount == 0;
  local_58.pointer = filename._reader.pointers;
  if (bVar7) {
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.nestingLimit = 0x7fffffff;
  if (!bVar7) {
    local_58.nestingLimit = filename._reader.nestingLimit;
  }
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (!bVar7) {
    uVar8 = filename._reader.segment._0_4_;
    uVar9 = filename._reader.segment._4_4_;
    uVar10 = filename._reader.capTable._0_4_;
    uVar11 = filename._reader.capTable._4_4_;
  }
  local_58.segment = (SegmentReader *)CONCAT44(uVar9,uVar8);
  local_58.capTable = (CapTableReader *)CONCAT44(uVar11,uVar10);
  RVar12 = _::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  (*pRVar1->_vptr_Resolver[9])(&local_98,pRVar1,RVar12.super_StringPtr.content.ptr);
  local_78 = (char)local_98.content.ptr;
  if ((char)local_98.content.ptr == '\0') {
    bVar7 = filename._reader.pointerCount == 0;
    local_58.pointer = filename._reader.pointers;
    if (bVar7) {
      local_58.pointer = (WirePointer *)0x0;
    }
    local_58.nestingLimit = 0x7fffffff;
    if (!bVar7) {
      local_58.nestingLimit = filename._reader.nestingLimit;
    }
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    if (!bVar7) {
      uVar8 = filename._reader.segment._0_4_;
      uVar9 = filename._reader.segment._4_4_;
      uVar10 = filename._reader.capTable._0_4_;
      uVar11 = filename._reader.capTable._4_4_;
    }
    pEVar2 = this->errorReporter;
    local_58.segment = (SegmentReader *)CONCAT44(uVar9,uVar8);
    local_58.capTable = (CapTableReader *)CONCAT44(uVar11,uVar10);
    RVar12 = _::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
    local_30.ptr = RVar12.super_StringPtr.content.ptr;
    local_58.segment = (SegmentReader *)0x1cbf04;
    local_58.capTable = (CapTableReader *)0x1e;
    local_30.size_ = RVar12.super_StringPtr.content.size_ - 1;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_98,(_ *)&local_58,&local_30,&local_30);
    pcVar4 = local_98.content.ptr;
    if ((uchar *)local_98.content.size_ == (uchar *)0x0) {
      pcVar4 = "";
    }
    uVar5 = 0;
    if (filename._reader.dataSize < 0x20) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)*filename._reader.data;
      if (0x3f < filename._reader.dataSize) {
        uVar5 = (ulong)*(uint *)((long)filename._reader.data + 4);
      }
    }
    (**pEVar2->_vptr_ErrorReporter)
              (pEVar2,uVar6,uVar5,pcVar4,
               (uchar *)(local_98.content.size_ + ((uchar *)local_98.content.size_ == (uchar *)0x0))
              );
    sVar3 = local_98.content.size_;
    pcVar4 = local_98.content.ptr;
    if (local_98.content.ptr != (char *)0x0) {
      local_98.content.ptr = (char *)0x0;
      local_98.content.size_ = 0;
      (*(code *)**(undefined8 **)local_98.content.disposer)
                (local_98.content.disposer,pcVar4,1,sVar3,sVar3,0);
    }
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = (uchar *)local_98.content.size_;
    *(ArrayDisposer **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
         local_98.content.disposer;
    (__return_storage_ptr__->ptr).field_1.value.disposer = pAStack_80;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> NodeTranslator::readEmbed(LocatedText::Reader filename) {
  KJ_IF_MAYBE(data, resolver.readEmbed(filename.getValue())) {
    return kj::mv(*data);
  } else {
    errorReporter.addErrorOn(filename,
        kj::str("Couldn't read file for embed: ", filename.getValue()));
    return nullptr;
  }